

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcode.cpp
# Opt level: O0

char * jh_get_lexeme(char *b,int *type)

{
  int iVar1;
  int *i;
  int *__end1;
  int *__begin1;
  int (*__range1) [2];
  int new_type;
  int old_type;
  char *old_f;
  char *f;
  int curr_vec [2];
  int *type_local;
  char *b_local;
  
  __range1._4_4_ = -1;
  curr_vec = (int  [2])type;
  for (__end1 = (int *)&f; _new_type = b, old_f = b, __end1 != curr_vec; __end1 = __end1 + 1) {
    *__end1 = 1;
  }
  do {
    if (*old_f == '\0') {
      *(int *)curr_vec = __range1._4_4_;
LAB_00102686:
      b_local = _new_type + 1;
      return b_local;
    }
    jh_update_vec((int *)&f,*old_f);
    iVar1 = jh_detect_type((int *)&f);
    if (iVar1 < 0) {
      if (iVar1 == -1) {
        *(int *)curr_vec = __range1._4_4_;
        goto LAB_00102686;
      }
    }
    else {
      _new_type = old_f;
      __range1._4_4_ = iVar1;
    }
    old_f = old_f + 1;
  } while( true );
}

Assistant:

char *jh_get_lexeme(char *b, int *type) {
    int curr_vec[jh_type_cnt];
    char *f = b, *old_f = b;
    int old_type = -1, new_type = -1;
    for (int &i : curr_vec)
        i = 1;
    while(*f != '\0') {
        jh_update_vec(curr_vec, *f);
        new_type = jh_detect_type(curr_vec);
        if (new_type >= 0) {
            old_type = new_type;
            old_f = f;
        } else if (new_type == -1) {
            *type = old_type;
            return old_f + 1;
        }
        ++f;
    }
    *type = old_type;
    return old_f + 1;
}